

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O2

RK_S32 mpp_service_ioctl(RK_S32 fd,RK_U32 cmd,RK_U32 size,void *param)

{
  int iVar1;
  RK_U32 local_18 [3];
  undefined4 local_c;
  void *local_8;
  
  local_18[1] = 0;
  local_c = 0;
  local_18[0] = cmd;
  local_18[2] = size;
  local_8 = param;
  iVar1 = ioctl(fd,0x40047601,local_18);
  return iVar1;
}

Assistant:

RK_S32 mpp_service_ioctl(RK_S32 fd, RK_U32 cmd, RK_U32 size, void *param)
{
    MppReqV1 mpp_req;

    memset(&mpp_req, 0, sizeof(mpp_req));

    mpp_req.cmd = cmd;
    mpp_req.flag = 0;
    mpp_req.size = size;
    mpp_req.offset = 0;
    mpp_req.data_ptr = REQ_DATA_PTR(param);

    return (RK_S32)ioctl(fd, MPP_IOC_CFG_V1, &mpp_req);
}